

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O3

int __thiscall TFileNameDatabase::LoadFromStream(TFileNameDatabase *this,TByteStream *InStream)

{
  ulong uVar1;
  DWORD *pDVar2;
  int iVar3;
  TFileNameDatabase *this_00;
  
  iVar3 = TSparseArray::LoadFromStream(&this->CollisionTable,InStream);
  if (((((iVar3 == 0) &&
        (iVar3 = TSparseArray::LoadFromStream(&this->FileNameIndexes,InStream), iVar3 == 0)) &&
       (iVar3 = TSparseArray::LoadFromStream(&this->CollisionHiBitsIndexes,InStream), iVar3 == 0))
      && ((iVar3 = TGenericArray<unsigned_char>::LoadFromStream(&this->LoBitsTable,InStream),
          iVar3 == 0 &&
          (iVar3 = TBitEntryArray::LoadBitsFromStream(&this->HiBitsTable,InStream), iVar3 == 0))))
     && (iVar3 = TPathFragmentTable::LoadFromStream(&this->PathFragmentTable,InStream), iVar3 == 0))
  {
    if (((this->CollisionHiBitsIndexes).ValidItemCount != 0) &&
       ((this->PathFragmentTable).PathFragments.ItemCount == 0)) {
      this_00 = (TFileNameDatabase *)operator_new(0x248);
      TFileNameDatabase(this_00);
      iVar3 = SetChildDatabase(this,this_00);
      if (iVar3 != 0) {
        return iVar3;
      }
      iVar3 = LoadFromStream(this->pChildDB,InStream);
      if (iVar3 != 0) {
        return iVar3;
      }
    }
    iVar3 = TGenericArray<_HASH_ENTRY>::LoadFromStream(&this->HashTable,InStream);
    if (iVar3 == 0) {
      this->HashTableMask = (this->HashTable).ItemCount - 1;
      uVar1 = InStream->cbByteData;
      iVar3 = 1000;
      if (3 < uVar1) {
        pDVar2 = (DWORD *)InStream->pbByteData;
        InStream->pbByteData = (LPBYTE)(pDVar2 + 1);
        InStream->cbByteData = uVar1 - 4;
        this->field_214 = *pDVar2;
        if (3 < uVar1 - 4) {
          InStream->pbByteData = (LPBYTE)(pDVar2 + 2);
          InStream->cbByteData = uVar1 - 8;
          iVar3 = TStruct10::sub_19572E0(&this->Struct10,pDVar2[1]);
          return iVar3;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int LoadFromStream(TByteStream & InStream)
    {
        DWORD dwBitMask;
        int nError;

        nError = CollisionTable.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = FileNameIndexes.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = CollisionHiBitsIndexes.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        // HOTS: 019597CD
        nError = LoBitsTable.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = HiBitsTable.LoadBitsFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        // HOTS: 019597F5
        nError = PathFragmentTable.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        // HOTS: 0195980A
        if(CollisionHiBitsIndexes.ValidItemCount != 0 && PathFragmentTable.PathFragments.ItemCount == 0)
        {
            TFileNameDatabase * pNewDB;

            pNewDB = new TFileNameDatabase;
            if (pNewDB == NULL)
                return ERROR_NOT_ENOUGH_MEMORY;

            nError = SetChildDatabase(pNewDB);
            if(nError != ERROR_SUCCESS)
                return nError;

            nError = pChildDB->LoadFromStream(InStream);
            if(nError != ERROR_SUCCESS)
                return nError;
        }

        // HOTS: 0195986B
        nError = HashTable.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        HashTableMask = HashTable.ItemCount - 1;

        nError = InStream.GetValue<DWORD>(field_214);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = InStream.GetValue<DWORD>(dwBitMask);
        if(nError != ERROR_SUCCESS)
            return nError;

        return Struct10.sub_1957800(dwBitMask);
    }